

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

_Bool rsa_ssh1_decrypt_pkcs1(mp_int *input,RSAKey *key,strbuf *outbuf)

{
  uint8_t val;
  uchar uVar1;
  undefined1 uVar2;
  strbuf *buf_o;
  mp_int *x;
  size_t sVar3;
  long lVar4;
  ulong byte;
  BinarySource src [1];
  
  buf_o = strbuf_new_nm();
  x = rsa_privkey_op(input,key);
  sVar3 = mp_get_nbits(key->modulus);
  byte = sVar3 + 7 >> 3;
  while (byte = byte - 1, byte != 0xffffffffffffffff) {
    val = mp_get_byte(x,byte);
    BinarySink_put_byte(buf_o->binarysink_,val);
  }
  mp_free(x);
  src[0].data = buf_o->u;
  src[0].len = buf_o->len;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  src[0].binarysource_ = src;
  uVar1 = BinarySource_get_byte(src);
  if (uVar1 == '\0') {
    uVar1 = BinarySource_get_byte(src[0].binarysource_);
    if (uVar1 == '\x02') {
      uVar1 = BinarySource_get_byte(src[0].binarysource_);
      lVar4 = 6;
      if (uVar1 != '\0') {
        lVar4 = 0;
      }
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        lVar4 = 4;
      }
      uVar2 = (*(code *)((long)&DAT_0017d300 + (long)(int)(&DAT_0017d300)[lVar4]))();
      return (_Bool)uVar2;
    }
  }
  strbuf_free(buf_o);
  return false;
}

Assistant:

bool rsa_ssh1_decrypt_pkcs1(mp_int *input, RSAKey *key,
                            strbuf *outbuf)
{
    strbuf *data = strbuf_new_nm();
    bool success = false;
    BinarySource src[1];

    {
        mp_int *b = rsa_ssh1_decrypt(input, key);
        for (size_t i = (mp_get_nbits(key->modulus) + 7) / 8; i-- > 0 ;) {
            put_byte(data, mp_get_byte(b, i));
        }
        mp_free(b);
    }

    BinarySource_BARE_INIT(src, data->u, data->len);

    /* Check PKCS#1 formatting prefix */
    if (get_byte(src) != 0) goto out;
    if (get_byte(src) != 2) goto out;
    while (1) {
        unsigned char byte = get_byte(src);
        if (get_err(src)) goto out;
        if (byte == 0)
            break;
    }

    /* Everything else is the payload */
    success = true;
    put_data(outbuf, get_ptr(src), get_avail(src));

  out:
    strbuf_free(data);
    return success;
}